

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_allocator.h
# Opt level: O3

void __thiscall
density::detail::PageAllocator<density::detail::SystemPageManager<256UL>_>::dump_private_stack
          (PageAllocator<density::detail::SystemPageManager<256UL>_> *this,
          page_allocation_type i_allocation_type)

{
  bool bVar1;
  PageAllocatorSlot *pPVar2;
  
  if ((&this->m_private_page_stack)[i_allocation_type != uninitialized].m_first != (PageFooter *)0x0
     ) {
    pPVar2 = this->m_current_slot;
    while (bVar1 = WF_PageStack::try_push
                             (&pPVar2->m_page_stack + (i_allocation_type != uninitialized),
                              &this->m_private_page_stack + (i_allocation_type != uninitialized)),
          !bVar1) {
      pPVar2 = (this->m_current_slot->m_next_slot)._M_b._M_p;
      this->m_current_slot = pPVar2;
    }
  }
  return;
}

Assistant:

PageStack & get_private_stack(page_allocation_type const i_allocation_type) noexcept
            {
                DENSITY_ASSUME(
                  i_allocation_type == page_allocation_type::uninitialized ||
                  i_allocation_type == page_allocation_type::zeroed);
                return i_allocation_type == page_allocation_type::zeroed
                         ? m_private_zeroed_page_stack
                         : m_private_page_stack;
            }